

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

char * httplib::detail::find_content_type(string *path)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_30 [8];
  string ext;
  
  file_extension((string *)local_30,path);
  bVar1 = std::operator==((string *)local_30,"txt");
  if (bVar1) {
    pcVar2 = "text/plain";
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"html");
    if (bVar1) {
      pcVar2 = "text/html";
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"css");
      if (bVar1) {
        pcVar2 = "text/css";
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"jpeg");
        pcVar2 = "image/jpg";
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"jpg");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"png");
            if (bVar1) {
              pcVar2 = "image/png";
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_30,"gif");
              if (bVar1) {
                pcVar2 = "image/gif";
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_30,"svg");
                if (bVar1) {
                  pcVar2 = "image/svg+xml";
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_30,"ico");
                  if (bVar1) {
                    pcVar2 = "image/x-icon";
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_30,"json");
                    if (bVar1) {
                      pcVar2 = "application/json";
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_30,"pdf");
                      if (bVar1) {
                        pcVar2 = "application/pdf";
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_30,"js");
                        if (bVar1) {
                          pcVar2 = "application/javascript";
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_30,"xml");
                          if (bVar1) {
                            pcVar2 = "application/xml";
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_30,"xhtml");
                            pcVar2 = (char *)0x0;
                            if (bVar1) {
                              pcVar2 = "application/xhtml+xml";
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return pcVar2;
}

Assistant:

inline const char* find_content_type(const std::string& path)
{
    auto ext = file_extension(path);
    if (ext == "txt") {
        return "text/plain";
    } else if (ext == "html") {
        return "text/html";
    } else if (ext == "css") {
        return "text/css";
    } else if (ext == "jpeg" || ext == "jpg") {
        return "image/jpg";
    } else if (ext == "png") {
        return "image/png";
    } else if (ext == "gif") {
        return "image/gif";
    } else if (ext == "svg") {
        return "image/svg+xml";
    } else if (ext == "ico") {
        return "image/x-icon";
    } else if (ext == "json") {
        return "application/json";
    } else if (ext == "pdf") {
        return "application/pdf";
    } else if (ext == "js") {
        return "application/javascript";
    } else if (ext == "xml") {
        return "application/xml";
    } else if (ext == "xhtml") {
        return "application/xhtml+xml";
    }
    return nullptr;
}